

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
deqp::gles31::Functional::anon_unknown_1::genSetNthBitSampleMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,int nthBit)

{
  int iVar1;
  allocator_type local_19;
  
  iVar1 = nthBit + 0x1f;
  if (-1 < nthBit) {
    iVar1 = nthBit;
  }
  iVar1 = iVar1 >> 5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(long)(iVar1 + 1),&local_19);
  if (0x1f < nthBit) {
    memset((__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start,0,(ulong)(iVar1 - 1) * 4 + 4);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start[iVar1] =
       (uint)(1L << ((char)nthBit - (char)(iVar1 << 5) & 0x3fU));
  return __return_storage_ptr__;
}

Assistant:

static std::vector<deUint32> genSetNthBitSampleMask (int nthBit)
{
	const int				wordSize	= 32;
	const int				numWords	= getEffectiveSampleMaskWordCount(nthBit);
	const deUint32			topWordBits	= (deUint32)(nthBit - (numWords - 1) * wordSize);
	std::vector<deUint32>	mask		(numWords);

	for (int ndx = 0; ndx < numWords - 1; ++ndx)
		mask[ndx] = 0;

	mask[numWords - 1] = (deUint32)(1ULL << topWordBits);
	return mask;
}